

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O3

int __thiscall CCharmapToUniSB::mapchar(CCharmapToUniSB *this,wchar_t *ch,char **p,size_t *len)

{
  byte *pbVar1;
  
  if (*len != 0) {
    pbVar1 = (byte *)*p;
    *p = (char *)(pbVar1 + 1);
    *ch = *(wchar_t *)(&(this->super_CCharmapToUniSB_basic).field_0x20c + (ulong)*pbVar1 * 4);
    *len = *len - 1;
    return 1;
  }
  return 0;
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 1)
        {
            /* map the character */
            ch = map_[(unsigned char)*p++];

            /* deduct it from the length */
            len -= 1;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }